

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O2

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
          (iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *this,int *size)

{
  iStack<Imaginer::Utils::iRpn::RPNnode> *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_00;
  int local_44;
  long *local_40;
  ulong local_38;
  
  iVar2 = *size;
  lVar4 = (long)iVar2;
  this->_top = -1;
  this->_size = iVar2;
  local_38 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    local_38 = lVar4 * 0x10 + 8;
  }
  local_40 = (long *)operator_new__(local_38);
  piVar1 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)(local_40 + 1);
  *local_40 = lVar4;
  if (lVar4 != 0) {
    lVar3 = 0;
    this_00 = piVar1;
    do {
      local_44 = 0x400;
      iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(this_00,&local_44);
      lVar3 = lVar3 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar3 != lVar4 * 0x10);
  }
  this->_data = piVar1;
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }